

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop.c
# Opt level: O3

Qiniu_Error
Qiniu_FOP_Pfop(Qiniu_Client *self,Qiniu_FOP_PfopRet *ret,char *bucket,char *key,char **fops,
              int fopCount,char *pipeline,char *notifyURL,int force)

{
  Qiniu_Error QVar1;
  Qiniu_FOP_PfopParams local_40;
  
  local_40.workflowTemplateID = (char *)0x0;
  local_40.type = 0;
  local_40._60_4_ = 0;
  local_40.pipeline = pipeline;
  local_40.notifyURL = notifyURL;
  local_40.force = force;
  local_40.fopCount = fopCount;
  local_40.bucket = bucket;
  local_40.key = key;
  local_40.fops = fops;
  QVar1 = Qiniu_FOP_Pfop_v2(self,ret,&local_40);
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_FOP_Pfop(Qiniu_Client *self, Qiniu_FOP_PfopRet *ret, const char *bucket, const char *key,
                           char *fops[], int fopCount, const char *pipeline, const char *notifyURL, int force)
{
    Qiniu_FOP_PfopParams params;
    Qiniu_Zero(params);
    params.bucket = bucket;
    params.key = key;
    params.fops = (char **)fops;
    params.fopCount = fopCount;
    params.pipeline = pipeline;
    params.notifyURL = notifyURL;
    params.force = force;
    return Qiniu_FOP_Pfop_v2(self, ret, &params);
}